

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  bool bVar1;
  cmComputeLinkInformation *this_01;
  ostream *poVar2;
  string newRpath;
  allocator local_51;
  string local_50;
  
  if (this->ImportLibrary == false) {
    bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
    if (bVar1) {
      this_00 = this->Target->Target->Makefile;
      std::__cxx11::string::string((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_51);
      bVar1 = cmMakefile::IsOn(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) {
        this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
        if (this_01 != (cmComputeLinkInformation *)0x0) {
          cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_50,this_01);
          poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar2 = std::operator<<(poVar2,"file(RPATH_CHECK\n");
          poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)indent.Level);
          poVar2 = std::operator<<(poVar2,"     FILE \"");
          poVar2 = std::operator<<(poVar2,(string *)toDestDirPath);
          poVar2 = std::operator<<(poVar2,"\"\n");
          poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)indent.Level);
          poVar2 = std::operator<<(poVar2,"     RPATH \"");
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          std::operator<<(poVar2,"\")\n");
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Get the install RPATH from the link information.
  std::string newRpath = cli->GetChrpathString();

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  /* clang-format off */
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n"
     << indent << "     RPATH \"" << newRpath << "\")\n";
  /* clang-format on */
}